

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

int archive_write_shar_header(archive_write *a,archive_entry *entry)

{
  int *piVar1;
  undefined8 uVar2;
  mode_t mVar3;
  int iVar4;
  archive_entry *paVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  la_int64_t lVar11;
  dev_t dVar12;
  dev_t dVar13;
  uint mode;
  shar *shar;
  char *pp;
  char *p;
  char *name;
  char *linkname;
  archive_entry *entry_local;
  archive_write *a_local;
  
  piVar1 = (int *)a->format_data;
  if (piVar1[0x16] == 0) {
    archive_strcat((archive_string *)(piVar1 + 0x18),"#!/bin/sh\n");
    archive_strcat((archive_string *)(piVar1 + 0x18),"# This is a shell archive\n");
    piVar1[0x16] = 1;
  }
  archive_entry_free(*(archive_entry **)(piVar1 + 2));
  paVar5 = archive_entry_clone(entry);
  *(archive_entry **)(piVar1 + 2) = paVar5;
  pcVar6 = archive_entry_pathname(entry);
  mVar3 = archive_entry_filetype(entry);
  if ((mVar3 == 0x1000) || (mVar3 == 0x2000)) {
LAB_001f0d5e:
    archive_entry_set_size(entry,0);
  }
  else if (mVar3 == 0x4000) {
    archive_entry_set_size(entry,0);
    iVar4 = strcmp(pcVar6,".");
    if ((iVar4 == 0) || (iVar4 = strcmp(pcVar6,"./"), iVar4 == 0)) {
      return 0;
    }
  }
  else {
    if (mVar3 == 0x6000) goto LAB_001f0d5e;
    if (mVar3 != 0x8000) {
      archive_entry_set_size(entry,0);
      pcVar7 = archive_entry_hardlink(entry);
      if ((pcVar7 == (char *)0x0) && (pcVar7 = archive_entry_symlink(entry), pcVar7 == (char *)0x0))
      {
        __archive_write_entry_filetype_unsupported(&a->archive,entry,"shar");
        return -0x14;
      }
    }
  }
  piVar1[0x20] = 0;
  piVar1[0x21] = 0;
  shar_quote((archive_string *)(piVar1 + 0x1e),pcVar6,1);
  archive_string_sprintf
            ((archive_string *)(piVar1 + 0x18),"echo x %s\n",*(undefined8 *)(piVar1 + 0x1e));
  mVar3 = archive_entry_filetype(entry);
  if (mVar3 != 0x4000) {
    pcVar7 = strdup(pcVar6);
    pcVar8 = strrchr(pcVar7,0x2f);
    if (pcVar8 == (char *)0x0) {
      free(pcVar7);
    }
    else {
      *pcVar8 = '\0';
      iVar4 = strcmp(pcVar7,".");
      if (iVar4 == 0) {
        free(pcVar7);
      }
      else if (*(long *)(piVar1 + 6) == 0) {
        archive_strcat((archive_string *)(piVar1 + 0x18),"mkdir -p ");
        shar_quote((archive_string *)(piVar1 + 0x18),pcVar7,1);
        archive_strcat((archive_string *)(piVar1 + 0x18)," > /dev/null 2>&1\n");
        *(char **)(piVar1 + 6) = pcVar7;
      }
      else {
        iVar4 = strcmp(pcVar7,*(char **)(piVar1 + 6));
        if (iVar4 == 0) {
          free(pcVar7);
        }
        else {
          sVar9 = strlen(pcVar7);
          sVar10 = strlen(*(char **)(piVar1 + 6));
          if (sVar9 < sVar10) {
            pcVar8 = *(char **)(piVar1 + 6);
            sVar9 = strlen(pcVar7);
            iVar4 = strncmp(pcVar7,pcVar8,sVar9);
            if (iVar4 == 0) {
              free(pcVar7);
              goto LAB_001f0fa3;
            }
          }
          archive_strcat((archive_string *)(piVar1 + 0x18),"mkdir -p ");
          shar_quote((archive_string *)(piVar1 + 0x18),pcVar7,1);
          archive_strcat((archive_string *)(piVar1 + 0x18)," > /dev/null 2>&1\n");
          *(char **)(piVar1 + 6) = pcVar7;
        }
      }
    }
  }
LAB_001f0fa3:
  piVar1[4] = 0;
  pcVar7 = archive_entry_hardlink(entry);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = archive_entry_symlink(entry);
    if (pcVar7 == (char *)0x0) {
      mVar3 = archive_entry_filetype(entry);
      if (mVar3 == 0x1000) {
        archive_string_sprintf
                  ((archive_string *)(piVar1 + 0x18),"mkfifo %s\n",*(undefined8 *)(piVar1 + 0x1e));
      }
      else if (mVar3 == 0x2000) {
        uVar2 = *(undefined8 *)(piVar1 + 0x1e);
        dVar12 = archive_entry_rdevmajor(entry);
        dVar13 = archive_entry_rdevminor(entry);
        archive_string_sprintf
                  ((archive_string *)(piVar1 + 0x18),"mknod %s c %ju %ju\n",uVar2,dVar12,dVar13);
      }
      else if (mVar3 == 0x4000) {
        archive_string_sprintf
                  ((archive_string *)(piVar1 + 0x18),"mkdir -p %s > /dev/null 2>&1\n",
                   *(undefined8 *)(piVar1 + 0x1e));
        free(*(void **)(piVar1 + 6));
        pcVar6 = strdup(pcVar6);
        *(char **)(piVar1 + 6) = pcVar6;
        pcVar6 = strrchr(*(char **)(piVar1 + 6),0x2f);
        if ((pcVar6 != (char *)0x0) && (pcVar6[1] == '\0')) {
          *pcVar6 = '\0';
        }
      }
      else if (mVar3 == 0x6000) {
        uVar2 = *(undefined8 *)(piVar1 + 0x1e);
        dVar12 = archive_entry_rdevmajor(entry);
        dVar13 = archive_entry_rdevminor(entry);
        archive_string_sprintf
                  ((archive_string *)(piVar1 + 0x18),"mknod %s b %ju %ju\n",uVar2,dVar12,dVar13);
      }
      else {
        if (mVar3 != 0x8000) {
          return -0x14;
        }
        lVar11 = archive_entry_size(entry);
        if (lVar11 == 0) {
          archive_string_sprintf
                    ((archive_string *)(piVar1 + 0x18),"test -e \"%s\" || :> \"%s\"\n",
                     *(undefined8 *)(piVar1 + 0x1e),*(undefined8 *)(piVar1 + 0x1e));
        }
        else {
          if (*piVar1 == 0) {
            archive_string_sprintf
                      ((archive_string *)(piVar1 + 0x18),"sed \'s/^X//\' > %s << \'SHAR_END\'\n",
                       *(undefined8 *)(piVar1 + 0x1e));
          }
          else {
            mVar3 = archive_entry_mode(entry);
            archive_string_sprintf
                      ((archive_string *)(piVar1 + 0x18),"uudecode -p > %s << \'SHAR_END\'\n",
                       *(undefined8 *)(piVar1 + 0x1e));
            archive_string_sprintf
                      ((archive_string *)(piVar1 + 0x18),"begin %o ",(ulong)(mVar3 & 0x1ff));
            shar_quote((archive_string *)(piVar1 + 0x18),pcVar6,0);
            archive_strcat((archive_string *)(piVar1 + 0x18),"\n");
          }
          piVar1[4] = 1;
          piVar1[1] = 1;
          piVar1[0x14] = 0;
          piVar1[0x15] = 0;
        }
      }
    }
    else {
      archive_strcat((archive_string *)(piVar1 + 0x18),"ln -fs ");
      shar_quote((archive_string *)(piVar1 + 0x18),pcVar7,1);
      archive_string_sprintf
                ((archive_string *)(piVar1 + 0x18)," %s\n",*(undefined8 *)(piVar1 + 0x1e));
    }
  }
  else {
    archive_strcat((archive_string *)(piVar1 + 0x18),"ln -f ");
    shar_quote((archive_string *)(piVar1 + 0x18),pcVar7,1);
    archive_string_sprintf((archive_string *)(piVar1 + 0x18)," %s\n",*(undefined8 *)(piVar1 + 0x1e))
    ;
  }
  return 0;
}

Assistant:

static int
archive_write_shar_header(struct archive_write *a, struct archive_entry *entry)
{
	const char *linkname;
	const char *name;
	char *p, *pp;
	struct shar *shar;

	shar = (struct shar *)a->format_data;
	if (!shar->wrote_header) {
		archive_strcat(&shar->work, "#!/bin/sh\n");
		archive_strcat(&shar->work, "# This is a shell archive\n");
		shar->wrote_header = 1;
	}

	/* Save the entry for the closing. */
	archive_entry_free(shar->entry);
	shar->entry = archive_entry_clone(entry);
	name = archive_entry_pathname(entry);

	/* Handle some preparatory issues. */
	switch(archive_entry_filetype(entry)) {
	case AE_IFREG:
		/* Only regular files have non-zero size. */
		break;
	case AE_IFDIR:
		archive_entry_set_size(entry, 0);
		/* Don't bother trying to recreate '.' */
		if (strcmp(name, ".") == 0  ||  strcmp(name, "./") == 0)
			return (ARCHIVE_OK);
		break;
	case AE_IFIFO:
	case AE_IFCHR:
	case AE_IFBLK:
		/* All other file types have zero size in the archive. */
		archive_entry_set_size(entry, 0);
		break;
	default:
		archive_entry_set_size(entry, 0);
		if (archive_entry_hardlink(entry) == NULL &&
		    archive_entry_symlink(entry) == NULL) {
			__archive_write_entry_filetype_unsupported(
			    &a->archive, entry, "shar");
			return (ARCHIVE_WARN);
		}
	}

	archive_string_empty(&shar->quoted_name);
	shar_quote(&shar->quoted_name, name, 1);

	/* Stock preparation for all file types. */
	archive_string_sprintf(&shar->work, "echo x %s\n", shar->quoted_name.s);

	if (archive_entry_filetype(entry) != AE_IFDIR) {
		/* Try to create the dir. */
		p = strdup(name);
		pp = strrchr(p, '/');
		/* If there is a / character, try to create the dir. */
		if (pp != NULL) {
			*pp = '\0';

			/* Try to avoid a lot of redundant mkdir commands. */
			if (strcmp(p, ".") == 0) {
				/* Don't try to "mkdir ." */
				free(p);
			} else if (shar->last_dir == NULL) {
				archive_strcat(&shar->work, "mkdir -p ");
				shar_quote(&shar->work, p, 1);
				archive_strcat(&shar->work,
				    " > /dev/null 2>&1\n");
				shar->last_dir = p;
			} else if (strcmp(p, shar->last_dir) == 0) {
				/* We've already created this exact dir. */
				free(p);
			} else if (strlen(p) < strlen(shar->last_dir) &&
			    strncmp(p, shar->last_dir, strlen(p)) == 0) {
				/* We've already created a subdir. */
				free(p);
			} else {
				archive_strcat(&shar->work, "mkdir -p ");
				shar_quote(&shar->work, p, 1);
				archive_strcat(&shar->work,
				    " > /dev/null 2>&1\n");
				shar->last_dir = p;
			}
		} else {
			free(p);
		}
	}

	/* Handle file-type specific issues. */
	shar->has_data = 0;
	if ((linkname = archive_entry_hardlink(entry)) != NULL) {
		archive_strcat(&shar->work, "ln -f ");
		shar_quote(&shar->work, linkname, 1);
		archive_string_sprintf(&shar->work, " %s\n",
		    shar->quoted_name.s);
	} else if ((linkname = archive_entry_symlink(entry)) != NULL) {
		archive_strcat(&shar->work, "ln -fs ");
		shar_quote(&shar->work, linkname, 1);
		archive_string_sprintf(&shar->work, " %s\n",
		    shar->quoted_name.s);
	} else {
		switch(archive_entry_filetype(entry)) {
		case AE_IFREG:
			if (archive_entry_size(entry) == 0) {
				/* More portable than "touch." */
				archive_string_sprintf(&shar->work,
				    "test -e \"%s\" || :> \"%s\"\n",
				    shar->quoted_name.s, shar->quoted_name.s);
			} else {
				if (shar->dump) {
					unsigned int mode = archive_entry_mode(entry) & 0777;
					archive_string_sprintf(&shar->work,
					    "uudecode -p > %s << 'SHAR_END'\n",
					    shar->quoted_name.s);
					archive_string_sprintf(&shar->work,
					    "begin %o ", mode);
					shar_quote(&shar->work, name, 0);
					archive_strcat(&shar->work, "\n");
				} else {
					archive_string_sprintf(&shar->work,
					    "sed 's/^X//' > %s << 'SHAR_END'\n",
					    shar->quoted_name.s);
				}
				shar->has_data = 1;
				shar->end_of_line = 1;
				shar->outpos = 0;
			}
			break;
		case AE_IFDIR:
			archive_string_sprintf(&shar->work,
			    "mkdir -p %s > /dev/null 2>&1\n",
			    shar->quoted_name.s);
			/* Record that we just created this directory. */
			free(shar->last_dir);

			shar->last_dir = strdup(name);
			/* Trim a trailing '/'. */
			pp = strrchr(shar->last_dir, '/');
			if (pp != NULL && pp[1] == '\0')
				*pp = '\0';
			/*
			 * TODO: Put dir name/mode on a list to be fixed
			 * up at end of archive.
			 */
			break;
		case AE_IFIFO:
			archive_string_sprintf(&shar->work,
			    "mkfifo %s\n", shar->quoted_name.s);
			break;
		case AE_IFCHR:
			archive_string_sprintf(&shar->work,
			    "mknod %s c %ju %ju\n", shar->quoted_name.s,
			    (uintmax_t)archive_entry_rdevmajor(entry),
			    (uintmax_t)archive_entry_rdevminor(entry));
			break;
		case AE_IFBLK:
			archive_string_sprintf(&shar->work,
			    "mknod %s b %ju %ju\n", shar->quoted_name.s,
			    (uintmax_t)archive_entry_rdevmajor(entry),
			    (uintmax_t)archive_entry_rdevminor(entry));
			break;
		default:
			return (ARCHIVE_WARN);
		}
	}

	return (ARCHIVE_OK);
}